

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  const_iterator __position;
  bool bVar2;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  undefined4 extraout_var;
  _Alloc_hider _Var7;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  string responseFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_698;
  string linkRuleName;
  int major;
  size_type local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  string targetVersionMajor;
  string cmakeVarLang;
  undefined1 local_5f8 [32];
  pointer local_5d8;
  pointer local_5d0;
  pointer local_5c8;
  char *local_5b8;
  char *local_5b0;
  char *local_580;
  char *local_570;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  pointer local_538;
  char *local_530;
  char *local_528;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  string targetVersionMinor;
  string cmakeLinkVar;
  string local_4a8;
  cmNinjaRule rule;
  string langFlags;
  string local_340 [32];
  char local_320 [32];
  char local_300 [280];
  string local_1e8;
  string local_1c8;
  string launcher;
  
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  LanguageLinkerRule_abi_cxx11_(&linkRuleName,this);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar3,&linkRuleName);
  if (!bVar2) {
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkRuleName._M_dataplus._M_p == &linkRuleName.field_2) {
      local_4a8.field_2._8_8_ = linkRuleName.field_2._8_8_;
    }
    else {
      local_4a8._M_dataplus._M_p = linkRuleName._M_dataplus._M_p;
    }
    local_4a8._M_string_length = linkRuleName._M_string_length;
    linkRuleName._M_string_length = 0;
    linkRuleName.field_2._M_local_buf[0] = '\0';
    linkRuleName._M_dataplus._M_p = (pointer)&linkRuleName.field_2;
    cmNinjaRule::cmNinjaRule(&rule,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_5f8);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_5f8._0_8_ = (psVar4->_M_dataplus)._M_p;
    local_5f8._8_8_ = cmState::GetTargetTypeName(targetType);
    psVar4 = &this->TargetLinkLanguage;
    local_5c8 = (this->TargetLinkLanguage)._M_dataplus._M_p;
    bVar2 = std::operator==(psVar4,"Swift");
    if (bVar2) {
      local_510 = "$SWIFT_LIBRARY_NAME";
      local_508 = "$SWIFT_MODULE";
      local_500 = "$SWIFT_MODULE_NAME";
      local_4f8 = "$SWIFT_OUTPUT_FILE_MAP";
      local_4f0 = "$SWIFT_SOURCES";
      local_530 = "$DEFINES";
      local_570 = "$FLAGS";
      local_528 = "$INCLUDES";
    }
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_allocated_capacity =
         responseFlag.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakeVarLang,"CMAKE_",(allocator<char> *)&langFlags);
    std::__cxx11::string::append((string *)&cmakeVarLang);
    std::operator+(&cmakeLinkVar,&cmakeVarLang,"_RESPONSE_FILE_LINK_FLAG");
    pcVar5 = cmMakefile::GetDefinition
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                        &cmakeLinkVar);
    if ((pcVar5 != (char *)0x0) || (bVar2 = std::operator!=(psVar4,"CUDA"), bVar2)) {
      std::__cxx11::string::assign((char *)&responseFlag);
    }
    pcVar5 = "$LINK_PATH $LINK_LIBRARIES";
    lVar6 = 0x38;
    _Var7._M_p = "$in";
    if ((useResponseFile) && (responseFlag._M_string_length != 0)) {
      std::__cxx11::string::assign((char *)&rule.RspFile);
      std::__cxx11::string::append((string *)&responseFlag);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign((char *)&rule.RspContent);
      std::__cxx11::string::append((char *)&rule.RspContent);
      bVar2 = std::operator==(psVar4,"Swift");
      lVar6 = 0x38;
      if (bVar2) {
        lVar6 = 0x108;
      }
      pcVar5 = "";
      _Var7 = responseFlag._M_dataplus;
    }
    *(pointer *)(local_5f8 + lVar6) = _Var7._M_p;
    local_580 = "$OBJECT_DIR";
    local_5b8 = "$TARGET_FILE";
    local_560 = "$SONAME_FLAG";
    local_558 = "$SONAME";
    local_550 = "$INSTALLNAME_DIR";
    local_5f8._16_8_ = "$TARGET_PDB";
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    local_5b0 = pcVar5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&langFlags);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&launcher);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &major,(int *)&linkCmds);
    std::ostream::operator<<(&langFlags,major);
    std::ostream::operator<<
              (&launcher,
               (int)linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&launcher);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&langFlags);
    local_5d8 = targetVersionMajor._M_dataplus._M_p;
    local_5d0 = targetVersionMinor._M_dataplus._M_p;
    local_570 = "$FLAGS";
    local_548 = "$LINK_FLAGS";
    langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
    langFlags._M_string_length = 0;
    local_540 = "$MANIFESTS";
    langFlags.field_2._M_local_buf[0] = '\0';
    if (targetType != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
      local_538 = langFlags._M_dataplus._M_p;
    }
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"RULE_LAUNCH_LINK",(allocator<char> *)&major);
    pcVar5 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,target,&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::string::assign((char *)&launcher);
      std::__cxx11::string::append((char *)&launcher);
    }
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
         (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
           super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
    ComputeLinkCmd_abi_cxx11_(&linkCmds,this);
    for (psVar4 = (string *)
                  CONCAT44(linkCmds.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)linkCmds.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        psVar4 != linkCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
      std::operator+(&local_698,&launcher,psVar4);
      std::__cxx11::string::operator=((string *)psVar4,(string *)&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 outputConverter,psVar4,(RuleVariables *)local_5f8);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    __position._M_current._4_4_ =
         linkCmds.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    __position._M_current._0_4_ =
         (int)linkCmds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"$PRE_LINK",(allocator<char> *)&major);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&linkCmds,__position,&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
               (char (*) [12])"$POST_BUILD");
    _major = (pointer)&local_648;
    local_650 = 0;
    local_648._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_698,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds,
               (string *)&major,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::string::~string((string *)&major);
    psVar4 = &rule.Comment;
    std::__cxx11::string::assign((char *)psVar4);
    std::__cxx11::string::append((string *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    psVar4 = &rule.Description;
    std::__cxx11::string::assign((char *)psVar4);
    std::__cxx11::string::append((string *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::assign((char *)&rule.Restat);
    pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar3,&rule);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr(&rulePlaceholderExpander);
    std::__cxx11::string::~string((string *)&launcher);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::~string((string *)&targetVersionMinor);
    std::__cxx11::string::~string((string *)&targetVersionMajor);
    std::__cxx11::string::~string((string *)&cmakeLinkVar);
    std::__cxx11::string::~string((string *)&cmakeVarLang);
    std::__cxx11::string::~string((string *)&responseFlag);
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  bVar2 = std::operator!=(&(this->TargetNames).Output,&(this->TargetNames).Real);
  if ((bVar2) &&
     (bVar2 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar2)) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&launcher,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar4,SHELL);
    if (targetType == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"CMAKE_SYMLINK_EXECUTABLE",(allocator<char> *)&rule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&langFlags,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      responseFlag._M_dataplus._M_p = (pointer)0x0;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_allocated_capacity = 0;
      std::operator+(&rule.Name,&launcher," -E cmake_symlink_executable $in $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 &rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 (char (*) [12])"$POST_BUILD");
      local_5f8._0_8_ = local_5f8 + 0x10;
      local_5f8._8_8_ = (char *)0x0;
      local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
      cmLocalNinjaGenerator::BuildCommandLine
                (&rule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&responseFlag,(string *)local_5f8,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_340,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::~string((string *)local_5f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&responseFlag);
      std::__cxx11::string::assign(local_320);
      std::__cxx11::string::assign(local_300);
      pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)&langFlags);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"CMAKE_SYMLINK_LIBRARY",(allocator<char> *)&rule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&langFlags,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      responseFlag._M_dataplus._M_p = (pointer)0x0;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_allocated_capacity = 0;
      std::operator+(&rule.Name,&launcher," -E cmake_symlink_library $in $SONAME $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 &rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 (char (*) [12])"$POST_BUILD");
      local_5f8._0_8_ = local_5f8 + 0x10;
      local_5f8._8_8_ = (char *)0x0;
      local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
      cmLocalNinjaGenerator::BuildCommandLine
                (&rule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&responseFlag,(string *)local_5f8,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_340,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::~string((string *)local_5f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&responseFlag);
      std::__cxx11::string::assign(local_320);
      std::__cxx11::string::assign(local_300);
      pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)&langFlags);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&langFlags);
    std::__cxx11::string::~string((string *)&launcher);
  }
  std::__cxx11::string::~string((string *)&linkRuleName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule();
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);

    vars.Language = this->TargetLinkLanguage.c_str();

    if (this->TargetLinkLanguage == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftOutputFileMap = "$SWIFT_OUTPUT_FILE_MAP";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang = "CMAKE_";
    cmakeVarLang += this->TargetLinkLanguage;

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = flag;
    } else if (this->TargetLinkLanguage != "CUDA") {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    rule.Comment = "Rule for linking ";
    rule.Comment += this->TargetLinkLanguage;
    rule.Comment += " ";
    rule.Comment += this->GetVisibleTypeName();
    rule.Comment += ".";
    rule.Description = "Linking ";
    rule.Description += this->TargetLinkLanguage;
    rule.Description += " ";
    rule.Description += this->GetVisibleTypeName();
    rule.Description += " $TARGET_FILE";
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (this->TargetNames.Output != this->TargetNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}